

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

size_t __thiscall
std::hash<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator()
          (hash<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *x)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RSI;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> c;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *__end0;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *__begin0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *__range2;
  uint out;
  uint in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this_00;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_28;
  uint local_14;
  
  local_14 = Lib::HashUtils::combine(0,0);
  local_28 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::begin
                       (in_RSI);
  this_00 = local_28;
  pMVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::end(in_RSI);
  pMVar2 = pMVar1;
  for (; local_28 != pMVar1; local_28 = local_28 + 1) {
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom(this_00,pMVar2);
    in_stack_ffffffffffffff94 =
         Lib::StlHash::
         hash<Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>>
                   ((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
                     *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff90 =
         Lib::StlHash::hash<Kernel::IntegerConstantType>
                   ((IntegerConstantType *)
                    CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_14 = Lib::HashUtils::combine<>
                         (in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c);
    in_stack_ffffffffffffff8c = local_14;
    Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x37390b);
  }
  return (ulong)local_14;
}

Assistant:

size_t operator()(Kernel::Polynom<NumTraits> const& x) const noexcept 
  {
    using namespace Lib;
    using namespace Kernel;

    unsigned out = HashUtils::combine(0,0);
    for (auto c : x._summands) {
      out = HashUtils::combine(
        StlHash::hash(c.factors),
        StlHash::hash(c.numeral),
        out
      );
    }
    return out;
  }